

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

osfildef * os_create_tempfile(char *fname,char *buf)

{
  undefined1 *in_RSI;
  char *in_RDI;
  FILE *local_8;
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    *in_RSI = 0;
    local_8 = tmpfile();
  }
  else {
    local_8 = fopen(in_RDI,"w+b");
  }
  return (osfildef *)local_8;
}

Assistant:

osfildef*
os_create_tempfile( const char* fname, char* buf )
{
    if (fname != 0 and fname[0] != '\0') {
        // A filename has been specified; use it.
        return fopen(fname, "w+b");
    }

    //ASSERT(buf != 0);

    // No filename needed; create a nameless tempfile.
    buf[0] = '\0';
    return tmpfile();
}